

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::addDecorationId(Builder *this,Id id,Decoration decoration,Id idDecoration)

{
  Instruction *this_00;
  value_type local_30;
  Instruction *local_28;
  Instruction *dec;
  Decoration local_18;
  Id idDecoration_local;
  Decoration decoration_local;
  Id id_local;
  Builder *this_local;
  
  if (decoration != DecorationMax) {
    dec._4_4_ = idDecoration;
    local_18 = decoration;
    idDecoration_local = id;
    _decoration_local = this;
    this_00 = (Instruction *)::operator_new(0x60);
    spv::Instruction::Instruction(this_00,OpDecorateId);
    local_28 = this_00;
    spv::Instruction::reserveOperands(this_00,3);
    spv::Instruction::addIdOperand(local_28,idDecoration_local);
    spv::Instruction::addImmediateOperand(local_28,local_18);
    spv::Instruction::addIdOperand(local_28,dec._4_4_);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
               local_28);
    std::
    set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::insert(&this->decorations,&local_30);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_30);
  }
  return;
}

Assistant:

void Builder::addDecorationId(Id id, Decoration decoration, Id idDecoration)
{
    if (decoration == spv::DecorationMax)
        return;

    Instruction* dec = new Instruction(OpDecorateId);
    dec->reserveOperands(3);
    dec->addIdOperand(id);
    dec->addImmediateOperand(decoration);
    dec->addIdOperand(idDecoration);

    decorations.insert(std::unique_ptr<Instruction>(dec));
}